

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  ulong uVar1;
  long lVar2;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      uVar1 = *(ulong *)((long)&keys->size_ + lVar2);
      if (uVar1 < 8) {
        __assert_fail("internal_key.size() >= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                      ,0x5e,"Slice leveldb::ExtractUserKey(const Slice &)");
      }
      *(ulong *)((long)&keys->size_ + lVar2) = uVar1 - 8;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar2);
  }
  (*this->user_policy_->_vptr_FilterPolicy[3])();
  return;
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}